

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void __thiscall clunk::Node::GetPawnMoves<true,true>(Node *this,int from,int depth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  bool bVar12;
  ulong uStack_30;
  int cap;
  uint64_t mvs;
  int kdir;
  int to;
  int score;
  int pinDir;
  int depth_local;
  int from_local;
  Node *this_local;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x617,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x618,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  if ((undefined *)(&_board)[from] == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x619,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  if (*(char *)(&_board)[from] != '\x03') {
    __assert_fail("_board[from]->type == (color|Pawn)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61a,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  if ((uint)*(byte *)((&_board)[from] + 1) != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61b,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  iVar1 = GetPinDir(this,true,from);
  mvs._0_4_ = 0;
  if (depth == 0) {
    mvs._0_4_ = GetDiscoverDir(this,true,from);
    iVar2 = (int)mvs;
    if ((int)mvs < 1) {
      iVar2 = -(int)mvs;
    }
    if (iVar2 == 0x10) {
      mvs._0_4_ = 0;
    }
  }
  uStack_30 = *(ulong *)(_pawnCaps + (long)(from + 8) * 8);
  do {
    if (uStack_30 == 0) {
      if (depth == 0 || from / 0x10 == 1) {
        iVar2 = from + -0x10;
        if (iVar1 != 0) {
          iVar3 = Direction(from,iVar2);
          if (iVar3 < 1) {
            iVar3 = -iVar3;
          }
          if (iVar3 != iVar1) {
            return;
          }
        }
        if ((undefined *)(&_board)[iVar2] == _EMPTY) {
          if (iVar2 / 0x10 == 0) {
            AddMove(this,PawnMove,from,iVar2,0x3cf,0,0xb);
            if (depth == 0) {
              AddMove(this,PawnMove,from,iVar2,500,0,9);
              AddMove(this,PawnMove,from,iVar2,0x140,0,7);
              AddMove(this,PawnMove,from,iVar2,300,0,5);
            }
          }
          else {
            if (depth != 0) {
              __assert_fail("!depth",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x658,
                            "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                           );
            }
            if (((int)mvs != 0 || from - 0x21U == (uint)(byte)_KING[1]) ||
                from - 0x1fU == (uint)(byte)_KING[1]) {
              AddMove(this,PawnMove,from,iVar2,
                      (*(int *)(_PAWN_SQR + (long)(from + -8) * 4) -
                      *(int *)(_PAWN_SQR + (long)(from + 8) * 4)) + 0x19,0,0);
            }
            if (from / 0x10 == 6) {
              uVar11 = from - 0x20;
              if ((uVar11 & 0xffffff88) != 0) {
                __assert_fail("IS_SQUARE(to)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x669,
                              "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                             );
              }
              if (((undefined *)(&_board)[(int)uVar11] == _EMPTY) &&
                 (((int)mvs != 0 || from - 0x31U == (uint)(byte)_KING[1]) ||
                  from - 0x2fU == (uint)(byte)_KING[1])) {
                AddMove(this,PawnLung,from,uVar11,
                        (*(int *)(_PAWN_SQR + (long)(from + -0x18) * 4) -
                        *(int *)(_PAWN_SQR + (long)(from + 8) * 4)) + 0x1e,0,0);
              }
            }
          }
        }
      }
      return;
    }
    if ((uStack_30 & 0xff) == 0) {
      __assert_fail("mvs & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x629,
                    "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                   );
    }
    iVar2 = ((uint)uStack_30 & 0xff) - 1;
    iVar3 = Distance(from,iVar2);
    if (iVar3 != 1) {
      __assert_fail("Distance(from, to) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x62b,
                    "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                   );
    }
    iVar3 = Direction(from,iVar2);
    iVar4 = Direction(from,iVar2);
    iVar5 = Direction(from,iVar2);
    iVar6 = Direction(from,iVar2);
    iVar7 = Direction(from,iVar2);
    iVar8 = Direction(from,iVar2);
    iVar9 = Direction(from,iVar2);
    iVar10 = Direction(from,iVar2);
    if ((((iVar3 != -0x11 && iVar4 != -0xf) && iVar5 != 0xf) && iVar6 != 0x11) &&
        (((iVar7 != -0x10 && iVar8 != -1) && iVar9 != 1) && iVar10 != 0x10)) {
      __assert_fail("IS_DIR(Direction(from, to))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x62c,
                    "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                   );
    }
    if (iVar1 == 0) {
LAB_0014c19e:
      uVar11 = (uint)*(byte *)(&_board)[iVar2];
      bVar12 = true;
      if (uVar11 == 0) {
        bVar12 = (undefined *)(&_board)[iVar2] == _EMPTY;
      }
      if (!bVar12) {
        __assert_fail("cap || (_board[to] == _EMPTY)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x631,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                     );
      }
      if (uVar11 == 0) {
        if (((this->ep != 0x78) && (iVar2 == this->ep)) &&
           (bVar12 = EpPinned<true>(from,this->ep + 0x10), !bVar12)) {
          AddMove(this,PawnCap,from,iVar2,100,0,0);
        }
      }
      else if ((*(byte *)(&_board)[iVar2] & 1) == 0) {
        iVar3 = ValueOf(uVar11);
        if (iVar2 / 0x10 == 0) {
          AddMove(this,PawnCap,from,iVar2,iVar3 + 0x3cf,uVar11,0xb);
          if (depth == 0) {
            AddMove(this,PawnCap,from,iVar2,iVar3 + 500,uVar11,9);
            AddMove(this,PawnCap,from,iVar2,iVar3 + 0x140,uVar11,7);
            AddMove(this,PawnCap,from,iVar2,iVar3 + 300,uVar11,5);
          }
        }
        else {
          AddMove(this,PawnCap,from,iVar2,iVar3,uVar11,0);
        }
      }
    }
    else {
      iVar3 = Direction(from,iVar2);
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      if (iVar3 == iVar1) goto LAB_0014c19e;
    }
    uStack_30 = uStack_30 >> 8;
  } while( true );
}

Assistant:

void GetPawnMoves(const int from, const int depth) {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|Pawn));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    int score;
    int to;

    int kdir = 0;
    if (qsearch & (!depth)) {
      kdir = GetDiscoverDir(color, from);
      if (abs(kdir) == North) {
        kdir = 0;
      }
    }

    for (uint64_t mvs = _pawnCaps[from + (color * 8)]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      to = ((mvs & 0xFF) - 1);
      assert(Distance(from, to) == 1);
      assert(IS_DIR(Direction(from, to)));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        continue;
      }
      const int cap = _board[to]->type;
      assert(cap || (_board[to] == _EMPTY));
      if (!cap) {
        if ((ep != None) && (to == ep) &&
            !EpPinned<color>(from, (ep + (color ? North : South))))
        {
          AddMove(PawnCap, from, to, PawnValue);
        }
      }
      else if (COLOR(cap) != color) {
        score = ValueOf(cap);
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnCap, from, to, (score + QueenValue),  cap, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnCap, from, to, (score + RookValue),   cap, (color|Rook));
            AddMove(PawnCap, from, to, (score + BishopValue), cap, (color|Bishop));
            AddMove(PawnCap, from, to, (score + KnightValue), cap, (color|Knight));
          }
        }
        else {
          AddMove(PawnCap, from, to, score, cap);
        }
      }
    }
    if (!qsearch || ((!depth) | (YC(from) == (color ? 1 : 6)))) {
      to = (from + (color ? South : North));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        return;
      }
      if (_board[to] == _EMPTY) {
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnMove, from, to, QueenValue,  0, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnMove, from, to, RookValue,   0, (color|Rook));
            AddMove(PawnMove, from, to, BishopValue, 0, (color|Bishop));
            AddMove(PawnMove, from, to, KnightValue, 0, (color|Knight));
          }
        }
        else {
          if (qsearch) {
            assert(!depth);
            if (kdir |
                ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
            {
              score = (_PAWN_SQR[to + (8 * color)] -
                       _PAWN_SQR[from + (8 * color)] + 25);
              AddMove(PawnMove, from, to, score);
            }
          }
          else {
            score = (_PAWN_SQR[to + (8 * color)] -
                     _PAWN_SQR[from + (8 * color)] + 5);
            AddMove(PawnMove, from, to, score);
          }
          if (YC(from) == (color ? 6 : 1)) {
            to += (color ? South : North);
            assert(IS_SQUARE(to));
            if (_board[to] == _EMPTY) {
              if (qsearch) {
                assert(!depth);
                if (kdir |
                    ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                    ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
                {
                  score = (_PAWN_SQR[to + (8 * color)] -
                           _PAWN_SQR[from + (8 * color)] + 30);
                  AddMove(PawnLung, from, to, score);
                }
              }
              else {
                score = (_PAWN_SQR[to + (8 * color)] -
                         _PAWN_SQR[from + (8 * color)] + 10);
                AddMove(PawnLung, from, to, score);
              }
            }
          }
        }
      }
    }
  }